

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O3

void Kit_TruthMuxVar(uint *pOut,uint *pCof0,uint *pCof1,int nVars,int iVar)

{
  ulong uVar1;
  byte bVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint *puVar8;
  ulong uVar9;
  
  uVar5 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar5 = 1;
  }
  if (nVars <= iVar) {
    __assert_fail("iVar < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                  ,0x432,
                  "void Kit_TruthMuxVar(unsigned int *, unsigned int *, unsigned int *, int, int)");
  }
  switch(iVar) {
  case 0:
    if (0 < (int)uVar5) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xaaaaaaaa | pCof0[uVar1] & 0x55555555;
        uVar1 = uVar1 + 1;
      } while (uVar5 != uVar1);
    }
    break;
  case 1:
    if (0 < (int)uVar5) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xcccccccc | pCof0[uVar1] & 0x33333333;
        uVar1 = uVar1 + 1;
      } while (uVar5 != uVar1);
    }
    break;
  case 2:
    if (0 < (int)uVar5) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xf0f0f0f0 | pCof0[uVar1] & 0xf0f0f0f;
        uVar1 = uVar1 + 1;
      } while (uVar5 != uVar1);
    }
    break;
  case 3:
    if (0 < (int)uVar5) {
      uVar1 = 0;
      do {
        pOut[uVar1] = pCof1[uVar1] & 0xff00ff00 | pCof0[uVar1] & 0xff00ff;
        uVar1 = uVar1 + 1;
      } while (uVar5 != uVar1);
    }
    break;
  case 4:
    if (0 < (int)uVar5) {
      uVar1 = 0;
      do {
        pOut[uVar1] = CONCAT22(*(undefined2 *)((long)pCof1 + uVar1 * 4 + 2),(short)pCof0[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar5 != uVar1);
    }
    break;
  default:
    if (0 < (int)uVar5) {
      bVar2 = (byte)(iVar + -5);
      uVar7 = 1 << (bVar2 & 0x1f);
      iVar6 = 2 << (bVar2 & 0x1f);
      uVar1 = 1;
      if (1 < (int)uVar7) {
        uVar1 = (ulong)uVar7;
      }
      puVar3 = pCof1 + (int)uVar7;
      puVar8 = pOut + (int)uVar7;
      iVar4 = 0;
      do {
        if (iVar + -5 != 0x1f) {
          uVar9 = 0;
          do {
            pOut[uVar9] = pCof0[uVar9];
            puVar8[uVar9] = puVar3[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar1 != uVar9);
        }
        iVar4 = iVar4 + iVar6;
        puVar3 = puVar3 + iVar6;
        puVar8 = puVar8 + iVar6;
        pOut = pOut + iVar6;
        pCof0 = pCof0 + iVar6;
      } while (iVar4 < (int)uVar5);
    }
  }
  return;
}

Assistant:

void Kit_TruthMuxVar( unsigned * pOut, unsigned * pCof0, unsigned * pCof1, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x55555555) | (pCof1[i] & 0xAAAAAAAA);
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x33333333) | (pCof1[i] & 0xCCCCCCCC);
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x0F0F0F0F) | (pCof1[i] & 0xF0F0F0F0);
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x00FF00FF) | (pCof1[i] & 0xFF00FF00);
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pOut[i] = (pCof0[i] & 0x0000FFFF) | (pCof1[i] & 0xFFFF0000);
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pOut[i]      = pCof0[i];
                pOut[Step+i] = pCof1[Step+i];
            }
            pOut += 2*Step;
            pCof0 += 2*Step;
            pCof1 += 2*Step;
        }
        return;
    }
}